

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_info.cpp
# Opt level: O2

void __thiscall
duckdb::ChunkVectorInfo::CommitDelete
          (ChunkVectorInfo *this,transaction_t commit_id,DeleteInfo *info)

{
  idx_t i;
  ulong uVar1;
  uint16_t *puVar2;
  idx_t i_1;
  
  if (info->is_consecutive == true) {
    for (uVar1 = 0; uVar1 < info->count; uVar1 = uVar1 + 1) {
      this->deleted[uVar1] = commit_id;
    }
  }
  else {
    puVar2 = DeleteInfo::GetRows(info);
    for (uVar1 = 0; uVar1 < info->count; uVar1 = uVar1 + 1) {
      this->deleted[puVar2[uVar1]] = commit_id;
    }
  }
  return;
}

Assistant:

void ChunkVectorInfo::CommitDelete(transaction_t commit_id, const DeleteInfo &info) {
	if (info.is_consecutive) {
		for (idx_t i = 0; i < info.count; i++) {
			deleted[i] = commit_id;
		}
	} else {
		auto rows = info.GetRows();
		for (idx_t i = 0; i < info.count; i++) {
			deleted[rows[i]] = commit_id;
		}
	}
}